

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_composite_constructor_expression_abi_cxx11_
          (CompilerGLSL *this,uint32_t id,bool uses_buffer_offset)

{
  bool bVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  Compiler *this_00;
  byte local_7a;
  byte local_79;
  byte local_5d;
  undefined1 local_50 [47];
  bool reroll_array;
  SPIRType *type;
  bool uses_buffer_offset_local;
  Compiler *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id);
  type._4_4_ = (uint32_t)CONCAT71(in_register_00000011,uses_buffer_offset);
  type._3_1_ = in_CL & 1;
  pCStack_18 = this_00;
  this_local = this;
  register0x00000000 = Compiler::expression_type(this_00,type._4_4_);
  bVar1 = VectorView<unsigned_int>::empty
                    (&(register0x00000000->array).super_VectorView<unsigned_int>);
  local_5d = 0;
  if (!bVar1) {
    local_79 = 1;
    if (((ulong)this_00[2].active_interface_variables._M_h._M_single_bucket & 0x100) != 0) {
      local_7a = 0;
      if ((type._3_1_ & 1) != 0) {
        local_7a = *(byte *)((long)&this_00[2].active_interface_variables._M_h._M_single_bucket + 2)
                   ^ 0xff;
      }
      local_79 = local_7a;
    }
    local_5d = local_79;
  }
  local_50[0x27] = local_5d & 1;
  if (local_50[0x27] == 0) {
    to_unpacked_expression_abi_cxx11_(this,id,SUB41(type._4_4_,0));
  }
  else {
    to_enclosed_expression_abi_cxx11_((CompilerGLSL *)local_50,id,SUB41(type._4_4_,0));
    to_rerolled_array_expression(this,(string *)this_00,(SPIRType *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  return this;
}

Assistant:

string CompilerGLSL::to_composite_constructor_expression(uint32_t id, bool uses_buffer_offset)
{
	auto &type = expression_type(id);

	bool reroll_array = !type.array.empty() && (!backend.array_is_value_type ||
	                                            (uses_buffer_offset && !backend.buffer_offset_array_is_value_type));

	if (reroll_array)
	{
		// For this case, we need to "re-roll" an array initializer from a temporary.
		// We cannot simply pass the array directly, since it decays to a pointer and it cannot
		// participate in a struct initializer. E.g.
		// float arr[2] = { 1.0, 2.0 };
		// Foo foo = { arr }; must be transformed to
		// Foo foo = { { arr[0], arr[1] } };
		// The array sizes cannot be deduced from specialization constants since we cannot use any loops.

		// We're only triggering one read of the array expression, but this is fine since arrays have to be declared
		// as temporaries anyways.
		return to_rerolled_array_expression(to_enclosed_expression(id), type);
	}
	else
		return to_unpacked_expression(id);
}